

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

void __thiscall lest::confirm::~confirm(confirm *this)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *local_e8;
  long local_e0;
  char local_d8 [16];
  char *local_c8;
  long local_c0;
  char local_b8 [8];
  undefined8 uStack_b0;
  char *local_a8;
  long local_a0;
  char local_98 [8];
  undefined8 uStack_90;
  char *local_88;
  long local_80;
  char local_78 [8];
  undefined8 uStack_70;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_00107933;
    poVar3 = (this->super_action).os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All ",4);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    puVar5 = local_58;
    local_68 = puVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"test","");
    if (this->selected == 1) {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_68,local_68 + local_60);
    }
    else {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_68,local_68 + local_60);
      std::__cxx11::string::append((char *)&local_e8);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_e8,local_e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"passed.\n","");
    lVar2 = local_a0;
    if (local_a8 == local_98) {
      uStack_b0 = uStack_90;
      local_c8 = local_b8;
    }
    else {
      local_c8 = local_a8;
    }
    local_c0 = local_a0;
    local_a0 = 0;
    local_98[0] = '\0';
    local_a8 = local_98;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_c8,lVar2);
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
    puVar4 = local_68;
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
      puVar4 = local_68;
    }
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," out of ",8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    puVar5 = local_38;
    local_48 = puVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"test","");
    if (this->selected == 1) {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_48,local_48 + local_40);
    }
    else {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_48,local_48 + local_40);
      std::__cxx11::string::append((char *)&local_e8);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_e8,local_e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"failed.\n","");
    lVar2 = local_80;
    if (local_88 == local_78) {
      uStack_b0 = uStack_70;
      local_c8 = local_b8;
    }
    else {
      local_c8 = local_88;
    }
    local_c0 = local_80;
    local_80 = 0;
    local_78[0] = '\0';
    local_88 = local_78;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_c8,lVar2);
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    puVar4 = local_48;
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
      puVar4 = local_48;
    }
  }
  if (puVar4 != puVar5) {
    operator_delete(puVar4);
  }
LAB_00107933:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output).testing.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }